

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addConstraintElem(Molecule *this,ConstraintElem *cp)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_> *in_RDI;
  __normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::begin
                     (in_RDI);
  __val = std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::end
                    (in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::ConstraintElem**,std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>>,OpenMD::ConstraintElem*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::end
                    (in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::push_back
              ((vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_> *)
               __last._M_current,__val._M_current);
  }
  return;
}

Assistant:

void Molecule::addConstraintElem(ConstraintElem* cp) {
    if (std::find(constraintElems_.begin(), constraintElems_.end(), cp) ==
        constraintElems_.end()) {
      constraintElems_.push_back(cp);
    }
  }